

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void rebuildPage(MemPage *pPg,int nCell,u8 **apCell,u16 *szCell)

{
  int iVar1;
  void *pvVar2;
  uint uVar3;
  uint uVar4;
  void *pvVar5;
  void *pvVar6;
  long in_RCX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  u8 *pCell;
  u8 *pData;
  u8 *pTmp;
  u8 *pCellptr;
  int i;
  u8 *pEnd;
  int usableSize;
  u8 *aData;
  int hdr;
  void *local_68;
  void *local_60;
  undefined1 *local_50;
  int local_44;
  
  uVar3 = (uint)*(byte *)(in_RDI + 6);
  pvVar2 = *(void **)(in_RDI + 0x50);
  iVar1 = *(int *)(*(long *)(in_RDI + 0x48) + 0x34);
  pvVar5 = (void *)((long)pvVar2 + (long)iVar1);
  local_50 = *(undefined1 **)(in_RDI + 0x60);
  pvVar6 = sqlite3PagerTempSpace((Pager *)**(undefined8 **)(in_RDI + 0x48));
  uVar4 = (uint)CONCAT11(*(undefined1 *)((long)pvVar2 + (long)(int)(uVar3 + 5)),
                         *(undefined1 *)((long)pvVar2 + (long)(int)(uVar3 + 5) + 1));
  memcpy((void *)((long)pvVar6 + (long)(int)uVar4),(void *)((long)pvVar2 + (long)(int)uVar4),
         (long)(int)(iVar1 - uVar4));
  local_60 = pvVar5;
  for (local_44 = 0; local_44 < in_ESI; local_44 = local_44 + 1) {
    local_68 = *(void **)(in_RDX + (long)local_44 * 8);
    if ((pvVar2 < local_68) && (local_68 < pvVar5)) {
      local_68 = (void *)((long)pvVar6 + ((long)local_68 - (long)pvVar2));
    }
    local_60 = (void *)((long)local_60 - (long)(int)(uint)*(ushort *)(in_RCX + (long)local_44 * 2));
    memcpy(local_60,local_68,(ulong)*(ushort *)(in_RCX + (long)local_44 * 2));
    *local_50 = (char)((ulong)((long)local_60 - (long)pvVar2) >> 8);
    local_50[1] = (char)local_60 - (char)pvVar2;
    local_50 = local_50 + 2;
  }
  *(short *)(in_RDI + 0x12) = (short)in_ESI;
  *(undefined1 *)(in_RDI + 1) = 0;
  *(undefined1 *)((long)pvVar2 + (long)(int)(uVar3 + 1)) = 0;
  *(undefined1 *)((long)pvVar2 + (long)(int)(uVar3 + 1) + 1) = 0;
  *(char *)((long)pvVar2 + (long)(int)(uVar3 + 3)) =
       (char)((ushort)*(undefined2 *)(in_RDI + 0x12) >> 8);
  *(char *)((long)pvVar2 + (long)(int)(uVar3 + 3) + 1) = (char)*(undefined2 *)(in_RDI + 0x12);
  *(char *)((long)pvVar2 + (long)(int)(uVar3 + 5)) =
       (char)((ulong)((long)local_60 - (long)pvVar2) >> 8);
  *(char *)((long)pvVar2 + (long)(int)(uVar3 + 5) + 1) = (char)local_60 - (char)pvVar2;
  *(undefined1 *)((long)pvVar2 + (long)(int)(uVar3 + 7)) = 0;
  return;
}

Assistant:

static void rebuildPage(
  MemPage *pPg,                   /* Edit this page */
  int nCell,                      /* Final number of cells on page */
  u8 **apCell,                    /* Array of cells */
  u16 *szCell                     /* Array of cell sizes */
){
  const int hdr = pPg->hdrOffset;          /* Offset of header on pPg */
  u8 * const aData = pPg->aData;           /* Pointer to data for pPg */
  const int usableSize = pPg->pBt->usableSize;
  u8 * const pEnd = &aData[usableSize];
  int i;
  u8 *pCellptr = pPg->aCellIdx;
  u8 *pTmp = sqlite3PagerTempSpace(pPg->pBt->pPager);
  u8 *pData;

  i = get2byte(&aData[hdr+5]);
  memcpy(&pTmp[i], &aData[i], usableSize - i);

  pData = pEnd;
  for(i=0; i<nCell; i++){
    u8 *pCell = apCell[i];
    if( pCell>aData && pCell<pEnd ){
      pCell = &pTmp[pCell - aData];
    }
    pData -= szCell[i];
    memcpy(pData, pCell, szCell[i]);
    put2byte(pCellptr, (pData - aData));
    pCellptr += 2;
    assert( szCell[i]==cellSizePtr(pPg, pCell) );
  }

  /* The pPg->nFree field is now set incorrectly. The caller will fix it. */
  pPg->nCell = nCell;
  pPg->nOverflow = 0;

  put2byte(&aData[hdr+1], 0);
  put2byte(&aData[hdr+3], pPg->nCell);
  put2byte(&aData[hdr+5], pData - aData);
  aData[hdr+7] = 0x00;
}